

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOldSat.c
# Opt level: O2

Vec_Int_t *
Saig_ManExtendCounterExampleTest3(Aig_Man_t *pAig,int iFirstFlopPi,Abc_Cex_t *pCex,int fVerbose)

{
  abctime aVar1;
  Saig_RefMan_t *p;
  Vec_Int_t *vReasons;
  Vec_Int_t *pVVar2;
  abctime aVar3;
  int level;
  
  if (pAig->nTruePis == pCex->nPis) {
    aVar1 = Abc_Clock();
    p = Saig_RefManStart(pAig,pCex,iFirstFlopPi,fVerbose);
    vReasons = Saig_RefManFindReason(p);
    pVVar2 = Saig_RefManReason2Inputs(p,vReasons);
    level = 0x786d4f;
    printf("Frame PIs = %4d (essential = %4d)   AIG PIs = %4d (essential = %4d)   ",
           (ulong)(uint)p->pFrames->nObjs[2],(ulong)(uint)vReasons->nSize,
           (ulong)(uint)(p->pAig->nTruePis - p->nInputs),(ulong)(uint)pVVar2->nSize);
    Abc_Print(level,"%s =","Time");
    aVar3 = Abc_Clock();
    Abc_Print(level,"%9.2f sec\n",(double)(aVar3 - aVar1) / 1000000.0);
    Vec_IntFree(vReasons);
    Saig_RefManStop(p);
  }
  else {
    pVVar2 = (Vec_Int_t *)0x0;
    printf("Saig_ManExtendCounterExampleTest3(): The PI count of AIG (%d) does not match that of cex (%d).\n"
           ,(ulong)(uint)pAig->nObjs[2]);
  }
  return pVVar2;
}

Assistant:

Vec_Int_t * Saig_ManExtendCounterExampleTest3( Aig_Man_t * pAig, int iFirstFlopPi, Abc_Cex_t * pCex, int fVerbose )
{
    Saig_RefMan_t * p;
    Vec_Int_t * vRes, * vReasons;
    abctime clk;
    if ( Saig_ManPiNum(pAig) != pCex->nPis )
    {
        printf( "Saig_ManExtendCounterExampleTest3(): The PI count of AIG (%d) does not match that of cex (%d).\n", 
            Aig_ManCiNum(pAig), pCex->nPis );
        return NULL;
    }

clk = Abc_Clock();

    p = Saig_RefManStart( pAig, pCex, iFirstFlopPi, fVerbose );
    vReasons = Saig_RefManFindReason( p );
    vRes = Saig_RefManReason2Inputs( p, vReasons );

//    if ( fVerbose )
    {
        printf( "Frame PIs = %4d (essential = %4d)   AIG PIs = %4d (essential = %4d)   ",
            Aig_ManCiNum(p->pFrames), Vec_IntSize(vReasons), 
            Saig_ManPiNum(p->pAig) - p->nInputs, Vec_IntSize(vRes) );
ABC_PRT( "Time", Abc_Clock() - clk );
    }

/*
    ////////////////////////////////////
    Vec_IntFree( vReasons );
    vReasons = Saig_RefManRefineWithSat( p, vRes );
    ////////////////////////////////////

    // derive new result
    Vec_IntFree( vRes );
    vRes = Saig_RefManReason2Inputs( p, vReasons );
//    if ( fVerbose )
    {
        printf( "Frame PIs = %4d (essential = %4d)   AIG PIs = %4d (essential = %4d)   ",
            Aig_ManCiNum(p->pFrames), Vec_IntSize(vReasons), 
            Saig_ManPiNum(p->pAig) - p->nInputs, Vec_IntSize(vRes) );
ABC_PRT( "Time", Abc_Clock() - clk );
    }
*/

    Vec_IntFree( vReasons );
    Saig_RefManStop( p );
    return vRes;
}